

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O0

int yaml_queue_extend(void **start,void **head,void **tail,void **end)

{
  void *pvVar1;
  void *new_start;
  void **end_local;
  void **tail_local;
  void **head_local;
  void **start_local;
  
  if ((*start == *head) && (*tail == *end)) {
    pvVar1 = yaml_realloc(*start,((long)*end - (long)*start) * 2);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    *head = (void *)((long)pvVar1 + ((long)*head - (long)*start));
    *tail = (void *)((long)pvVar1 + ((long)*tail - (long)*start));
    *end = (void *)((long)pvVar1 + ((long)*end - (long)*start) * 2);
    *start = pvVar1;
  }
  if (*tail == *end) {
    if (*head != *tail) {
      memmove(*start,*head,(long)*tail - (long)*head);
    }
    *tail = (void *)(((long)*tail - (long)*head) + (long)*start);
    *head = *start;
  }
  return 1;
}

Assistant:

YAML_DECLARE(int)
yaml_queue_extend(void **start, void **head, void **tail, void **end)
{
    /* Check if we need to resize the queue. */

    if (*start == *head && *tail == *end) {
        void *new_start = yaml_realloc(*start,
                ((char *)*end - (char *)*start)*2);

        if (!new_start) return 0;

        *head = (char *)new_start + ((char *)*head - (char *)*start);
        *tail = (char *)new_start + ((char *)*tail - (char *)*start);
        *end = (char *)new_start + ((char *)*end - (char *)*start)*2;
        *start = new_start;
    }

    /* Check if we need to move the queue at the beginning of the buffer. */

    if (*tail == *end) {
        if (*head != *tail) {
            memmove(*start, *head, (char *)*tail - (char *)*head);
        }
        *tail = (char *)*tail - (char *)*head + (char *)*start;
        *head = *start;
    }

    return 1;
}